

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data.cpp
# Opt level: O0

Data * Data::equal(vector<Data_*,_std::allocator<Data_*>_> *dataPara)

{
  value_type pDVar1;
  value_type pDVar2;
  bool bVar3;
  reference ppDVar4;
  reference ppDVar5;
  long local_68;
  long local_58;
  Data *i;
  iterator __end1;
  iterator __begin1;
  vector<Data_*,_std::allocator<Data_*>_> *__range1;
  Data *b;
  Data *a;
  Data *result;
  vector<Data_*,_std::allocator<Data_*>_> *dataPara_local;
  
  ppDVar4 = std::vector<Data_*,_std::allocator<Data_*>_>::operator[](dataPara,0);
  pDVar1 = *ppDVar4;
  ppDVar4 = std::vector<Data_*,_std::allocator<Data_*>_>::operator[](dataPara,1);
  pDVar2 = *ppDVar4;
  if (pDVar1 == (value_type)0x0) {
    local_58 = 0;
  }
  else {
    local_58 = __dynamic_cast(pDVar1,&typeinfo,&Integer::typeinfo,0);
  }
  if (local_58 == 0) {
    if ((pDVar1->field_0xc & 1) == (pDVar2->field_0xc & 1)) {
      a = trueData;
    }
    else {
      a = falseData;
    }
  }
  else {
    if (pDVar2 == (value_type)0x0) {
      local_68 = 0;
    }
    else {
      local_68 = __dynamic_cast(pDVar2,&typeinfo,&Integer::typeinfo,0);
    }
    if (local_68 == 0) {
      a = falseData;
    }
    else if (pDVar1[1]._vptr_Data == pDVar2[1]._vptr_Data) {
      a = trueData;
    }
    else {
      a = falseData;
    }
  }
  __end1 = std::vector<Data_*,_std::allocator<Data_*>_>::begin(dataPara);
  i = (Data *)std::vector<Data_*,_std::allocator<Data_*>_>::end(dataPara);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Data_**,_std::vector<Data_*,_std::allocator<Data_*>_>_>
                                     *)&i), bVar3) {
    ppDVar5 = __gnu_cxx::__normal_iterator<Data_**,_std::vector<Data_*,_std::allocator<Data_*>_>_>::
              operator*(&__end1);
    check(*ppDVar5);
    __gnu_cxx::__normal_iterator<Data_**,_std::vector<Data_*,_std::allocator<Data_*>_>_>::operator++
              (&__end1);
  }
  if (dataPara != (vector<Data_*,_std::allocator<Data_*>_> *)0x0) {
    std::vector<Data_*,_std::allocator<Data_*>_>::~vector(dataPara);
    operator_delete(dataPara);
  }
  return a;
}

Assistant:

Data *Data::equal(std::vector<Data *> *dataPara) {
    Data *result = NULL;
    Data *a = (*dataPara)[0];
    Data *b = (*dataPara)[1];
    if (dynamic_cast<Integer *>(a) != NULL) {
        if (dynamic_cast<Integer *>(b) != NULL) {
            if (((Integer *) a)->value == ((Integer *) b)->value) {
                result = Data::trueData;
            } else {
                result = Data::falseData;
            }
        } else {
            result = Data::falseData;
        }
    } else {
        if (((Bool *) a)->value == ((Bool *) b)->value) {
            result = Data::trueData;
        } else {
            result = Data::falseData;
        }
    }
    for (auto i: *dataPara) {
        Data::check(i);
    }
    delete dataPara;
    return result;
}